

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetRootValueForTypeOf<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ThreadContext *pTVar6;
  RecyclableObject *propertyObject;
  Var pvVar7;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup autoCleanup;
  Var local_40;
  ThreadContext *local_38;
  
  local_38 = (ThreadContext *)CONCAT44(local_38._4_4_,inlineCacheIndex);
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1fbb,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pTVar6 = (ThreadContext *)FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_a8 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,inlineCache,(InlineCacheIndex)local_38,true)
  ;
  local_40 = (Var)0x0;
  local_38 = pTVar6;
  bVar3 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,&local_40,
                     (ScriptContext *)pTVar6,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)local_a8);
  pvVar7 = local_40;
  if (!bVar3) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
    pTVar6 = local_38;
    if ((bVar3) && (DAT_015bc46a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValueForTypeOf",propertyId,(ScriptContext *)local_38,
                 &object->super_RecyclableObject);
    }
    local_40 = (Var)0x0;
    JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex,(ScriptContext *)pTVar6,true);
    autoCatchHandlerExists.m_threadContext = pTVar6;
    bVar3 = ScriptContext::IsScriptContextInDebugMode((ScriptContext *)pTVar6);
    if (bVar3) {
      ScriptContext::GetDebugContext((ScriptContext *)pTVar6);
    }
    propertyObject = VarTo<Js::RecyclableObject>(object);
    BVar4 = GetProperty_Internal<false>
                      (object,propertyObject,true,propertyId,&local_40,(ScriptContext *)pTVar6,
                       (PropertyValueInfo *)local_a8);
    pvVar7 = (Var)(ulong)(uint)propertyId;
    if ((BVar4 != 0) &&
       (pvVar7 = local_40,
       *(Var *)(*(long *)&(pTVar6->super_DefaultRecyclerCollectionWrapper).
                          super_RecyclerCollectionWrapper._isScriptContextCloseGCPending + 0x4f8) ==
       local_40)) {
      JavascriptError::ThrowReferenceError((ScriptContext *)pTVar6,-0x7ff5ec07,(PCWSTR)0x0);
    }
    PatchGetRootValueForTypeOf<false,_Js::InlineCache>::AutoCleanup::~AutoCleanup
              ((AutoCleanup *)&autoCatchHandlerExists.m_threadContext);
    JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex);
    if (BVar4 == 0) {
      lVar1 = *(long *)&(pTVar6->super_DefaultRecyclerCollectionWrapper).
                        super_RecyclerCollectionWrapper._isScriptContextCloseGCPending;
      if (*(Var *)(lVar1 + 0x4f8) == local_40) {
        JavascriptError::ThrowReferenceError((ScriptContext *)pTVar6,-0x7ff5ec07,(PCWSTR)0x0);
      }
      pvVar7 = *(Var *)(lVar1 + 0x430);
    }
  }
  return pvVar7;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValueForTypeOf);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value = nullptr;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        value = nullptr;
        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        AssertOrFailFast(VarIsCorrectType(static_cast<RecyclableObject*>(object)));
        if (JavascriptOperators::GetRootProperty(object, propertyId, &value, scriptContext, &info))
        {
            if (scriptContext->IsUndeclBlockVar(value))
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }
        END_TYPEOF_ERROR_HANDLER(scriptContext, value);

        value = scriptContext->GetLibrary()->GetUndefined();
        return value;
        JIT_HELPER_END(Op_PatchGetRootValueForTypeOf);
    }